

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_string(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  long in_RSI;
  long in_RDI;
  exr_attr_string_t *tmp;
  exr_result_t rv;
  int *sz;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  sz = *(int **)(in_RSI + 0x18);
  eVar1 = save_attr_sz((_internal_exr_context *)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),(size_t)sz);
  if (eVar1 == 0) {
    eVar1 = (**(code **)(in_RDI + 0x30))(in_RDI,*(undefined8 *)(sz + 2),(long)*sz,in_RDI + 0xb0);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_string (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t       rv;
    exr_attr_string_t* tmp = a->string;

    rv = save_attr_sz (ctxt, (size_t) tmp->length);
    if (rv == EXR_ERR_SUCCESS)
        rv = ctxt->do_write (
            ctxt,
            tmp->str,
            (uint64_t) (tmp->length),
            &(ctxt->output_file_offset));
    return rv;
}